

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeAtomTypesSectionParser::parseLine
          (FluctuatingChargeAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  bool bVar1;
  FluctuatingTypeEnum FVar2;
  undefined8 uVar3;
  FluctuatingChargeAdapter *this_00;
  uint in_ECX;
  long in_RDI;
  RealType RVar4;
  StringTokenizer *this_01;
  RealType RVar5;
  __type_conflict _Var6;
  StringTokenizer *this_02;
  double dVar7;
  FluctuatingChargeAdapter fqa_2;
  int i_1;
  RealType coefficient_1;
  int power_1;
  int nPairs_1;
  DoublePolynomial vself_1;
  RealType nMobile;
  RealType nValence_1;
  FluctuatingChargeAdapter fqa_1;
  int i;
  RealType coefficient;
  int power;
  int nPairs;
  DoublePolynomial vself;
  RealType nValence;
  FluctuatingChargeAdapter fqa;
  RealType slaterZeta;
  int slaterN;
  RealType Jii;
  RealType chi;
  FluctuatingTypeEnum fqt;
  RealType chargeMass;
  RealType charge;
  FixedChargeAdapter fca;
  AtomType *atomType;
  string atomTypeName;
  RealType curvus;
  RealType chius;
  int nTokens;
  StringTokenizer tokenizer;
  Polynomial<double> *in_stack_fffffffffffffc48;
  errorStruct *peVar8;
  StringTokenizer *in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  StringTokenizer *in_stack_fffffffffffffc60;
  string *in_stack_fffffffffffffc68;
  FluctuatingChargeAtomTypesSectionParser *in_stack_fffffffffffffc70;
  string *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  ForceField *in_stack_fffffffffffffc90;
  RealType in_stack_fffffffffffffc98;
  FixedChargeAdapter *in_stack_fffffffffffffca0;
  StringTokenizer *in_stack_fffffffffffffcf8;
  DoublePolynomial *in_stack_fffffffffffffd08;
  double slaterZeta_00;
  DoublePolynomial *in_stack_fffffffffffffd10;
  int slaterN_00;
  RealType in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd28;
  FluctuatingChargeAdapter local_238;
  int local_22c;
  double local_228;
  int local_220;
  int local_21c;
  double local_1e8;
  double local_1e0;
  FluctuatingChargeAdapter local_1a8;
  int local_19c;
  double local_198;
  int local_190;
  int local_18c;
  RealType local_158;
  FluctuatingChargeAdapter local_150;
  double local_148;
  int local_13c;
  double local_138;
  double local_130;
  string local_128 [36];
  FluctuatingTypeEnum local_104;
  StringTokenizer *local_100;
  undefined8 local_f8;
  FixedChargeAdapter local_f0;
  AtomType *local_e8;
  string local_e0 [32];
  double local_c0;
  double local_b8;
  int local_b0;
  allocator<char> local_99;
  string local_98 [124];
  uint local_1c;
  
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc90,
             (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
             (allocator<char> *)in_stack_fffffffffffffc80);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)in_stack_fffffffffffffc90,
             (string *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
             in_stack_fffffffffffffc80);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  local_b0 = StringTokenizer::countTokens(in_stack_fffffffffffffc60);
  if (local_b0 < 3) {
    snprintf(painCave.errMsg,2000,
             "FluctuatingChargeAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)local_1c);
    painCave.isFatal = 1;
    simError();
  }
  RVar4 = ForceFieldOptions::getFluctuatingChargeEnergyUnitScaling((ForceFieldOptions *)0x1f148b);
  *(RealType *)(in_RDI + 0x60) = RVar4;
  RVar4 = ForceFieldOptions::getChargeUnitScaling((ForceFieldOptions *)0x1f14b5);
  *(RealType *)(in_RDI + 0x68) = RVar4;
  RVar4 = ForceFieldOptions::getDistanceUnitScaling((ForceFieldOptions *)0x1f14df);
  *(RealType *)(in_RDI + 0x70) = RVar4;
  RVar4 = ForceFieldOptions::getOxidationStateScaling((ForceFieldOptions *)0x1f1509);
  *(RealType *)(in_RDI + 0x78) = RVar4;
  local_b8 = *(double *)(in_RDI + 0x60) / *(double *)(in_RDI + 0x68);
  local_c0 = *(double *)(in_RDI + 0x60) / (*(double *)(in_RDI + 0x68) * *(double *)(in_RDI + 0x68));
  StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffcf8);
  local_e8 = ForceField::getAtomType
                       (in_stack_fffffffffffffc90,
                        (string *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  if (local_e8 == (AtomType *)0x0) {
    uVar3 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "FluctuatingChargeAtomTypesSectionParser Error: Atom Type [%s] has not been created yet\n"
             ,uVar3);
    painCave.isFatal = 1;
    simError();
  }
  else {
    FixedChargeAdapter::FixedChargeAdapter(&local_f0,local_e8);
    bVar1 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x1f15d1);
    if (!bVar1) {
      local_f8 = 0;
      FixedChargeAdapter::makeFixedCharge(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    }
  }
  this_01 = (StringTokenizer *)
            StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffc90);
  local_100 = this_01;
  StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffcf8);
  FVar2 = getFluctuatingTypeEnum(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  std::__cxx11::string::~string(local_128);
  local_b0 = local_b0 + -3;
  this_00 = (FluctuatingChargeAdapter *)(ulong)FVar2;
  local_104 = FVar2;
  switch(this_00) {
  case (FluctuatingChargeAdapter *)0x0:
    if (local_b0 < 4) {
      peVar8 = &painCave;
      snprintf(painCave.errMsg,2000,
               "FluctuatingChargeAtomTypesSectionParser Error: Not enough tokens at line %d\n",
               (ulong)local_1c);
      peVar8->isFatal = 1;
      simError();
    }
    else {
      slaterZeta_00 = local_b8;
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffc90);
      local_130 = slaterZeta_00 * RVar4;
      dVar7 = local_c0;
      RVar5 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffc90);
      slaterN_00 = (int)((ulong)RVar4 >> 0x20);
      local_138 = dVar7 * RVar5;
      local_13c = StringTokenizer::nextTokenAsInt((StringTokenizer *)in_stack_fffffffffffffc70);
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffc90);
      local_148 = RVar4 / *(double *)(in_RDI + 0x70);
      FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_150,local_e8);
      FluctuatingChargeAdapter::makeFluctuatingCharge
                ((FluctuatingChargeAdapter *)this_01,
                 (RealType)CONCAT44(FVar2,in_stack_fffffffffffffd28),(RealType)this_00,
                 in_stack_fffffffffffffd18,slaterN_00,slaterZeta_00);
    }
    break;
  case (FluctuatingChargeAdapter *)0x1:
    if ((local_b0 < 3) || (local_b0 % 2 != 1)) {
      snprintf(painCave.errMsg,2000,
               "FluctuatingChargeAtomTypesSectionParser Error: Not enough tokens at line %d\n",
               (ulong)local_1c);
      painCave.isFatal = 1;
      simError();
    }
    else {
      local_158 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffc90);
      local_b0 = local_b0 + -1;
      Polynomial<double>::Polynomial((Polynomial<double> *)0x1f199d);
      local_18c = local_b0 / 2;
      for (local_19c = 0; local_19c < local_18c; local_19c = local_19c + 1) {
        local_190 = StringTokenizer::nextTokenAsInt((StringTokenizer *)in_stack_fffffffffffffc70);
        RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffc90);
        dVar7 = *(double *)(in_RDI + 0x60);
        _Var6 = std::pow<double,int>
                          ((double)in_stack_fffffffffffffc50,
                           (int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
        local_198 = (RVar4 * dVar7) / _Var6;
        Polynomial<double>::setCoefficient
                  ((Polynomial<double> *)in_stack_fffffffffffffc60,
                   (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                   (double *)in_stack_fffffffffffffc50);
      }
      FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_1a8,local_e8);
      Polynomial<double>::Polynomial
                ((Polynomial<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      FluctuatingChargeAdapter::makeFluctuatingCharge
                (this_00,in_stack_fffffffffffffd18,(RealType)in_stack_fffffffffffffd10,
                 in_stack_fffffffffffffd08);
      Polynomial<double>::~Polynomial((Polynomial<double> *)0x1f1b2d);
      Polynomial<double>::~Polynomial((Polynomial<double> *)0x1f1b3a);
    }
    break;
  case (FluctuatingChargeAdapter *)0x2:
    if ((local_b0 < 3) || (local_b0 % 2 != 0)) {
      peVar8 = &painCave;
      snprintf(painCave.errMsg,2000,
               "FluctuatingChargeAtomTypesSectionParser Error: Not enough tokens at line %d\n",
               (ulong)local_1c);
      peVar8->isFatal = 1;
      simError();
    }
    else {
      RVar4 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffc90);
      local_1e0 = RVar4 * *(double *)(in_RDI + 0x78);
      local_b0 = local_b0 + -1;
      this_02 = (StringTokenizer *)
                StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffc90);
      local_1e8 = (double)this_02 * *(double *)(in_RDI + 0x78);
      local_b0 = local_b0 + -1;
      Polynomial<double>::Polynomial((Polynomial<double> *)0x1f1c6a);
      local_21c = local_b0 / 2;
      for (local_22c = 0; local_22c < local_21c; local_22c = local_22c + 1) {
        local_220 = StringTokenizer::nextTokenAsInt((StringTokenizer *)in_stack_fffffffffffffc70);
        dVar7 = *(double *)(in_RDI + 0x78);
        RVar4 = StringTokenizer::nextTokenAsDouble(this_02);
        dVar7 = dVar7 * dVar7 * RVar4 * *(double *)(in_RDI + 0x60);
        in_stack_fffffffffffffc70 =
             (FluctuatingChargeAtomTypesSectionParser *)
             std::pow<double,int>
                       ((double)in_stack_fffffffffffffc50,
                        (int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
        local_228 = dVar7 / (double)in_stack_fffffffffffffc70;
        Polynomial<double>::setCoefficient
                  ((Polynomial<double> *)in_stack_fffffffffffffc60,
                   (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                   (double *)in_stack_fffffffffffffc50);
      }
      FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_238,local_e8);
      in_stack_fffffffffffffc50 = local_100;
      Polynomial<double>::Polynomial((Polynomial<double> *)local_100,in_stack_fffffffffffffc48);
      FluctuatingChargeAdapter::makeFluctuatingCharge
                ((FluctuatingChargeAdapter *)this_01,
                 (RealType)CONCAT44(FVar2,in_stack_fffffffffffffd28),(RealType)this_00,
                 in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      Polynomial<double>::~Polynomial((Polynomial<double> *)0x1f1e2d);
      Polynomial<double>::~Polynomial((Polynomial<double> *)0x1f1e3a);
    }
    break;
  case (FluctuatingChargeAdapter *)0x4:
  default:
    peVar8 = &painCave;
    snprintf(painCave.errMsg,2000,
             "FluctuatingChargeAtomTypesSectionParser Error: Unknown Fluctuating Charge Type at line %d\n"
             ,(ulong)local_1c);
    peVar8->isFatal = 1;
    simError();
  }
  std::__cxx11::string::~string(local_e0);
  StringTokenizer::~StringTokenizer(in_stack_fffffffffffffc50);
  return;
}

Assistant:

void FluctuatingChargeAtomTypesSectionParser::parseLine(ForceField& ff,
                                                          const string& line,
                                                          int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    if (nTokens < 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FluctuatingChargeAtomTypesSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }

    // conversion to kcal / mol
    eus_ = options_.getFluctuatingChargeEnergyUnitScaling();
    // conversion to electrons
    cus_ = options_.getChargeUnitScaling();
    // conversion to angstroms
    dus_ = options_.getDistanceUnitScaling();
    // oxidation state scaling
    oss_ = options_.getOxidationStateScaling();

    // electronegativity conversion
    RealType chius = eus_ / cus_;
    // curvature (hardness) conversion
    RealType curvus = eus_ / (cus_ * cus_);

    string atomTypeName = tokenizer.nextToken();
    AtomType* atomType  = ff.getAtomType(atomTypeName);
    if (atomType != NULL) {
      FixedChargeAdapter fca = FixedChargeAdapter(atomType);

      // All fluctuating charges are charges, and if we haven't
      // already set values for the charge, then start with zero.
      if (!fca.isFixedCharge()) {
        RealType charge = 0.0;
        fca.makeFixedCharge(charge);
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FluctuatingChargeAtomTypesSectionParser Error: Atom Type [%s] "
               "has not been created yet\n",
               atomTypeName.c_str());
      painCave.isFatal = 1;
      simError();
    }

    RealType chargeMass     = tokenizer.nextTokenAsDouble();
    FluctuatingTypeEnum fqt = getFluctuatingTypeEnum(tokenizer.nextToken());

    nTokens -= 3;

    switch (fqt) {
    case fqtHardness:
      // For Rick, Stuart, Berne style fluctuating charges, there's a
      // self charge potential defined by electronegativity and
      // hardness. On molecular structures, the slater-type overlap
      // integral is used to compute the hardness.

      // atomTypeName, chargeMass, Hardness, electronegativity,
      //   hardness (Jii), slaterN, slaterZeta

      if (nTokens < 4) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeAtomTypesSectionParser Error: "
                 "Not enough tokens at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType chi        = chius * tokenizer.nextTokenAsDouble();
        RealType Jii        = curvus * tokenizer.nextTokenAsDouble();
        int slaterN         = tokenizer.nextTokenAsInt();
        RealType slaterZeta = tokenizer.nextTokenAsDouble() / dus_;

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
        fqa.makeFluctuatingCharge(chargeMass, chi, Jii, slaterN, slaterZeta);
      }
      break;

    case fqtEAMPolynomial:

      // For DR-EAM v1, oxidation state scaling is built in to
      // fluctuating charge parameters and nValence.

      if (nTokens < 3 || nTokens % 2 != 1) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeAtomTypesSectionParser Error: "
                 "Not enough tokens at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType nValence = tokenizer.nextTokenAsDouble();
        nTokens -= 1;

        DoublePolynomial vself;

        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;

        for (int i = 0; i < nPairs; ++i) {
          power       = tokenizer.nextTokenAsInt();
          coefficient = tokenizer.nextTokenAsDouble() * eus_ / pow(cus_, power);
          vself.setCoefficient(power, coefficient);
        }

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
        fqa.makeFluctuatingCharge(chargeMass, nValence, vself);
      }
      break;

    case fqtDREAM2:

      // For DR-EAM v2, oxidation state scaling (oss_) is a force
      // field parameter, fluctuating charge parameters, nValence, and
      // nMobile in the force field file should assume unit charge
      // oxidation state fits to ionization states and electron
      // affinities.

      if (nTokens < 3 || nTokens % 2 != 0) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeAtomTypesSectionParser Error: "
                 "Not enough tokens at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        // Neutral atom valence count
        RealType nValence = tokenizer.nextTokenAsDouble() * oss_;
        nTokens -= 1;
        // Mobile electron count
        RealType nMobile = tokenizer.nextTokenAsDouble() * oss_;
        nTokens -= 1;

        DoublePolynomial vself;

        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;

        for (int i = 0; i < nPairs; ++i) {
          power       = tokenizer.nextTokenAsInt();
          coefficient = oss_ * oss_ * tokenizer.nextTokenAsDouble() * eus_ /
                        pow(oss_ * cus_, power);

          vself.setCoefficient(power, coefficient);
        }

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);

        fqa.makeFluctuatingCharge(chargeMass, nValence, nMobile, vself);
      }
      break;

    case fqtUnknown:
    default:
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FluctuatingChargeAtomTypesSectionParser Error: "
               "Unknown Fluctuating Charge Type at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
      break;
    }
  }